

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall
moira::StrWriter::operator<<(StrWriter *this,Ea<(moira::Mode)6,_(moira::Size)1> *ea)

{
  long in_RSI;
  StrWriter *in_RDI;
  Ea<(moira::Mode)6,_(moira::Size)1> *in_stack_00000018;
  StrWriter *in_stack_00000020;
  Ea<(moira::Mode)6,_(moira::Size)1> *in_stack_00000028;
  StrWriter *in_stack_00000030;
  
  if ((*(uint *)(in_RSI + 8) & 0x100) == 0) {
    briefExtension<(moira::Mode)6,(moira::Size)1>(in_stack_00000020,in_stack_00000018);
  }
  else {
    fullExtension<(moira::Mode)6,(moira::Size)1>(in_stack_00000030,in_stack_00000028);
  }
  return in_RDI;
}

Assistant:

StrWriter&
StrWriter::operator<<(const Ea<M,S> &ea)
{
    switch (M) {

        case 0: // Dn
        {
            *this << Dn{ea.reg};
            break;
        }
        case 1: // An
        {
            *this << An{ea.reg};
            break;
        }
        case 2: // (An)
        {
            *this << "(" << An{ea.reg} << ")";
            break;
        }
        case 3:  // (An)+
        {
            *this << "(" << An{ea.reg} << ")+";
            break;
        }
        case 4: // -(An)
        {
            *this << "-(" << An{ea.reg} << ")";
            break;
        }
        case 5: // (d,An)
        {
            *this << "(" << Int{(i16)ea.ext1};
            *this << "," << An{ea.reg} << ")";
            break;
        }
        case 6: // (d,An,Xi)
        {
            (ea.ext1 & 0x100) ? fullExtension(ea) : briefExtension(ea);
            break;
        }
        case 7: // ABS.W
        {
            *this << UInt(ea.ext1);
            *this << (upper ? ".W" : ".w");
            break;
        }
        case 8: // ABS.L
        {
            *this << UInt(ea.ext1);
            *this << (upper ? ".L" : ".l");
            break;
        }
        case 9: // (d,PC)
        {
            *this << "(" << Int{(i16)ea.ext1} << ",PC)";
            auto resolved = UInt(ea.pc + (i16)ea.ext1 + 2);
            StrWriter(comment, hex, upper) << "; (" << resolved << ")" << Finish{};
            break;
        }
        case 10: // (d,PC,Xi)
        {
            (ea.ext1 & 0x100) ? fullExtension(ea) : briefExtension(ea);
            break;
        }
        case 11: // Imm
        {
            *this << Imu(ea.ext1);
            break;
        }
    }
    return *this;
}